

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O3

void Gia_Iso2ManPrepare(Gia_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  long lVar4;
  uint *puVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  
  uVar6 = p->nObjs;
  pGVar2 = p->pObjs;
  if ((int)uVar6 < 1) {
    pGVar2->Value = 0x1b47586d;
  }
  else {
    if (pGVar2 != (Gia_Obj_t *)0x0) {
      puVar5 = &pGVar2->Value;
      uVar7 = (ulong)uVar6;
      do {
        uVar3 = *(ulong *)(puVar5 + -2);
        uVar8 = 0;
        if ((uVar3 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar3) {
          iVar1 = *(int *)((long)puVar5 + (ulong)(uint)((int)(uVar3 & 0x1fffffff) << 2) * -3);
          iVar9 = *(int *)((long)puVar5 + (ulong)((uint)(uVar3 >> 0x1e) & 0x7ffffffc) * -3);
          if (iVar9 < iVar1) {
            iVar9 = iVar1;
          }
          uVar8 = iVar9 + 1;
        }
        *puVar5 = uVar8;
        puVar5 = puVar5 + 3;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
    pGVar2->Value = 0x1b47586d;
    if (uVar6 != 1) {
      puVar5 = &pGVar2[1].Value;
      lVar4 = (ulong)uVar6 - 1;
      do {
        uVar7 = *(ulong *)(puVar5 + -2);
        uVar6 = (uint)uVar7;
        if ((~uVar6 & 0x1fffffff) == 0 || (int)uVar6 < 0) {
          if ((~uVar6 & 0x9fffffff) == 0) {
            if ((int)((uint)(uVar7 >> 0x20) & 0x1fffffff) < p->vCis->nSize - p->nRegs) {
              *puVar5 = 0xfbea205c;
            }
            else {
              *puVar5 = 0x22924fcd;
            }
          }
        }
        else {
          *puVar5 = *(int *)((long)s_256Primes +
                            (ulong)((((uVar6 >> 0x1d & 1) != 0) + 0xf5 +
                                    (uint)((uVar7 >> 0x3d & 1) != 0)) * 4)) +
                    s_256Primes[(byte)*puVar5];
        }
        puVar5 = puVar5 + 3;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
  }
  return;
}

Assistant:

void Gia_Iso2ManPrepare( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObj( p, pObj, i )
        pObj->Value = Gia_ObjIsAnd(pObj) ? 1 + Abc_MaxInt(Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value) : 0;
    Gia_ManConst0(p)->Value = s_256Primes[ISO_MASK];
    Gia_ManForEachObj1( p, pObj, i )
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = s_256Primes[pObj->Value & ISO_MASK] + s_256Primes[ISO_MASK - 10 + Gia_ObjFaninC0(pObj) + Gia_ObjFaninC1(pObj)];
        else if ( Gia_ObjIsPi(p, pObj) )
            pObj->Value = s_256Primes[ISO_MASK-1];
        else if ( Gia_ObjIsRo(p, pObj) )
            pObj->Value = s_256Primes[ISO_MASK-2];
}